

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoLocator.cpp
# Opt level: O2

void __thiscall OpenMD::MoLocator::calcRef(MoLocator *this)

{
  RigidBodyStamp *this_00;
  pointer piVar1;
  pointer piVar2;
  AtomStamp *pAVar3;
  vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *pvVar4;
  _Alloc_hider _Var5;
  bool bVar6;
  int iVar7;
  long lVar8;
  int __denom;
  string *psVar9;
  MoleculeStamp *pMVar10;
  string *extraout_RDX;
  string *extraout_RDX_00;
  string *extraout_RDX_01;
  string *extraout_RDX_02;
  string *this_01;
  value_type_conflict1 *__x;
  size_t j;
  long lVar11;
  size_t i;
  ulong uVar12;
  RealType totMassInRb;
  RealType currAtomMass;
  Vector3d coor;
  vector<double,_std::allocator<double>_> mass;
  Vector3d refMolCom;
  long local_f8;
  value_type_conflict1 local_f0;
  vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *local_e8;
  RealType local_e0;
  string local_d8;
  _Vector_base<double,_std::allocator<double>_> local_b8;
  string *local_a0;
  long local_98;
  string *local_90;
  string local_88;
  Vector<double,_3U> local_68;
  undefined8 local_50 [4];
  
  local_b8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_b8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_b8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Vector<double,_3U>::Vector((Vector<double,_3U> *)&local_d8);
  Vector<double,_3U>::Vector(&local_68);
  pMVar10 = this->myStamp;
  psVar9 = (string *)
           ((long)(pMVar10->atomStamps_).
                  super__Vector_base<OpenMD::AtomStamp_*,_std::allocator<OpenMD::AtomStamp_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)(pMVar10->atomStamps_).
                  super__Vector_base<OpenMD::AtomStamp_*,_std::allocator<OpenMD::AtomStamp_*>_>.
                  _M_impl.super__Vector_impl_data._M_start >> 3);
  local_98 = (long)(pMVar10->rigidBodyStamps_).
                   super__Vector_base<OpenMD::RigidBodyStamp_*,_std::allocator<OpenMD::RigidBodyStamp_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(pMVar10->rigidBodyStamps_).
                   super__Vector_base<OpenMD::RigidBodyStamp_*,_std::allocator<OpenMD::RigidBodyStamp_*>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 3;
  local_e8 = &this->refCoords;
  local_f8 = 0;
  local_90 = psVar9;
  for (this_01 = (string *)0x0; local_90 != this_01;
      this_01 = (string *)((long)&(this_01->_M_dataplus)._M_p + 1)) {
    pMVar10 = this->myStamp;
    lVar8 = *(long *)((long)(pMVar10->atomStamps_).
                            super__Vector_base<OpenMD::AtomStamp_*,_std::allocator<OpenMD::AtomStamp_*>_>
                            ._M_impl.super__Vector_impl_data._M_start + (local_f8 >> 0x1d));
    if (*(char *)(lVar8 + 0xf0) == '\0') {
      local_a0 = this_01;
      std::__cxx11::string::string((string *)&local_88,(string *)&(pMVar10->Name).data_);
      _Var5._M_p = local_88._M_dataplus._M_p;
      std::__cxx11::string::string((string *)local_50,(string *)(lVar8 + 0x98));
      snprintf(painCave.errMsg,2000,
               "MoLocator::calcRef error.\n\tComponent %s, atom %s does not have a position specified.\n\tThis means MoLocator cannot initalize it\'s position.\n"
               ,_Var5._M_p,local_50[0]);
      std::__cxx11::string::~string((string *)local_50);
      std::__cxx11::string::~string((string *)&local_88);
      painCave.isFatal = 1;
      simError();
      pMVar10 = this->myStamp;
      this_01 = local_a0;
    }
    bVar6 = MoleculeStamp::isAtomInRigidBody(pMVar10,(int)this_01);
    psVar9 = extraout_RDX;
    if (!bVar6) {
      std::__cxx11::string::string((string *)&local_88,(string *)(lVar8 + 0x98));
      local_e0 = getAtomMass(&local_88,this->myFF);
      std::__cxx11::string::~string((string *)&local_88);
      std::vector<double,_std::allocator<double>_>::push_back
                ((vector<double,_std::allocator<double>_> *)&local_b8,&local_e0);
      local_d8._M_dataplus._M_p = *(pointer *)(lVar8 + 0xb8);
      local_d8._M_string_length = *(size_type *)(lVar8 + 0xc0);
      local_d8.field_2._M_allocated_capacity = (size_type)*(double *)(lVar8 + 200);
      std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::push_back
                (local_e8,(value_type *)&local_d8);
      psVar9 = extraout_RDX_00;
    }
    local_f8 = local_f8 + 0x100000000;
  }
  for (lVar8 = 0; pvVar4 = local_e8, lVar8 != local_98; lVar8 = lVar8 + 1) {
    this_00 = (this->myStamp->rigidBodyStamps_).
              super__Vector_base<OpenMD::RigidBodyStamp_*,_std::allocator<OpenMD::RigidBodyStamp_*>_>
              ._M_impl.super__Vector_impl_data._M_start[(int)lVar8];
    piVar1 = (this_00->members_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
    piVar2 = (this_00->members_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    local_d8._M_dataplus._M_p = (pointer)0x0;
    local_d8._M_string_length = 0;
    local_d8.field_2._M_allocated_capacity = 0;
    local_f0 = 0.0;
    for (lVar11 = 0; (long)piVar1 - (long)piVar2 >> 2 != lVar11; lVar11 = lVar11 + 1) {
      pMVar10 = this->myStamp;
      iVar7 = RigidBodyStamp::getMemberAt(this_00,(int)lVar11);
      pAVar3 = (pMVar10->atomStamps_).
               super__Vector_base<OpenMD::AtomStamp_*,_std::allocator<OpenMD::AtomStamp_*>_>._M_impl
               .super__Vector_impl_data._M_start[iVar7];
      std::__cxx11::string::string((string *)&local_88,(string *)&(pAVar3->Type).data_);
      local_e0 = getAtomMass(&local_88,this->myFF);
      std::__cxx11::string::~string((string *)&local_88);
      local_f0 = local_f0 + local_e0;
      local_d8._M_dataplus._M_p =
           (pointer)(local_e0 * (pAVar3->position_).super_Vector<double,_3U>.data_[0] +
                    local_d8._M_dataplus._M_p);
      local_d8._M_string_length =
           (size_type)
           (local_e0 * *(double *)((long)&(pAVar3->position_).super_Vector<double,_3U> + 8) +
           (double)local_d8._M_string_length);
      local_d8.field_2._M_allocated_capacity =
           (size_type)
           (local_e0 * *(double *)((long)&(pAVar3->position_).super_Vector<double,_3U> + 0x10) +
           local_d8.field_2._M_allocated_capacity);
    }
    __x = &local_f0;
    std::vector<double,_std::allocator<double>_>::push_back
              ((vector<double,_std::allocator<double>_> *)&local_b8,__x);
    this_01 = &local_d8;
    Vector<double,_3U>::div((Vector<double,_3U> *)this_01,(int)__x,__denom);
    std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::push_back
              (local_e8,(value_type *)this_01);
    psVar9 = extraout_RDX_01;
  }
  local_68.data_[0] = 0.0;
  local_68.data_[1] = 0.0;
  local_68.data_[2] = 0.0;
  lVar8 = 0;
  for (uVar12 = 0; uVar12 < this->nIntegrableObjects; uVar12 = uVar12 + 1) {
    operator*((Vector<double,_3U> *)&local_88,
              (Vector<double,_3U> *)
              ((long)(((pvVar4->
                       super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                       )._M_impl.super__Vector_impl_data._M_start)->super_Vector<double,_3U>).data_
              + lVar8),local_b8._M_impl.super__Vector_impl_data._M_start[uVar12]);
    this_01 = &local_88;
    Vector<double,_3U>::add(&local_68,(Vector<double,_3U> *)&local_88);
    lVar8 = lVar8 + 0x18;
    psVar9 = extraout_RDX_02;
  }
  Vector<double,_3U>::div(&local_68,(int)this_01,(int)psVar9);
  lVar8 = 0;
  for (uVar12 = 0; uVar12 < this->nIntegrableObjects; uVar12 = uVar12 + 1) {
    Vector<double,_3U>::sub
              ((Vector<double,_3U> *)
               ((long)(((pvVar4->
                        super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                        )._M_impl.super__Vector_impl_data._M_start)->super_Vector<double,_3U>).data_
               + lVar8),&local_68);
    lVar8 = lVar8 + 0x18;
  }
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_b8);
  return;
}

Assistant:

void MoLocator::calcRef(void) {
    AtomStamp* currAtomStamp;
    RigidBodyStamp* rbStamp;
    std::vector<RealType> mass;
    Vector3d coor;
    Vector3d refMolCom;
    RealType totMassInRb;
    RealType currAtomMass;
    RealType molMass;

    std::size_t nAtoms       = myStamp->getNAtoms();
    std::size_t nRigidBodies = myStamp->getNRigidBodies();

    for (std::size_t i = 0; i < nAtoms; i++) {
      currAtomStamp = myStamp->getAtomStamp(i);

      if (!currAtomStamp->havePosition()) {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "MoLocator::calcRef error.\n"
                 "\tComponent %s, atom %s does not have a position specified.\n"
                 "\tThis means MoLocator cannot initalize it's position.\n",
                 myStamp->getName().c_str(), currAtomStamp->getType().c_str());

        painCave.isFatal = 1;
        simError();
      }

      // if atom belongs to rigidbody, just skip it
      if (myStamp->isAtomInRigidBody(i)) continue;
      // get mass and the reference coordinate
      else {
        currAtomMass = getAtomMass(currAtomStamp->getType(), myFF);
        mass.push_back(currAtomMass);
        coor.x() = currAtomStamp->getPosX();
        coor.y() = currAtomStamp->getPosY();
        coor.z() = currAtomStamp->getPosZ();
        refCoords.push_back(coor);
      }
    }

    for (std::size_t i = 0; i < nRigidBodies; i++) {
      rbStamp                = myStamp->getRigidBodyStamp(i);
      std::size_t nAtomsInRb = rbStamp->getNMembers();

      coor.x()    = 0.0;
      coor.y()    = 0.0;
      coor.z()    = 0.0;
      totMassInRb = 0.0;

      for (std::size_t j = 0; j < nAtomsInRb; j++) {
        currAtomStamp = myStamp->getAtomStamp(rbStamp->getMemberAt(j));
        currAtomMass  = getAtomMass(currAtomStamp->getType(), myFF);
        totMassInRb += currAtomMass;

        coor.x() += currAtomStamp->getPosX() * currAtomMass;
        coor.y() += currAtomStamp->getPosY() * currAtomMass;
        coor.z() += currAtomStamp->getPosZ() * currAtomMass;
      }

      mass.push_back(totMassInRb);
      coor /= totMassInRb;
      refCoords.push_back(coor);
    }

    // calculate the reference center of mass
    molMass       = 0;
    refMolCom.x() = 0;
    refMolCom.y() = 0;
    refMolCom.z() = 0;

    for (std::size_t i = 0; i < nIntegrableObjects; i++) {
      refMolCom += refCoords[i] * mass[i];
      molMass += mass[i];
    }

    refMolCom /= molMass;

    // move the reference center of mass to (0,0,0) and adjust the
    // reference coordinate of the integrabel objects
    for (std::size_t i = 0; i < nIntegrableObjects; i++)
      refCoords[i] -= refMolCom;
  }